

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O3

bool __thiscall roaring::Roaring64Map::operator==(Roaring64Map *this,Roaring64Map *r)

{
  _Rb_tree_color _Var1;
  _Rb_tree_color _Var2;
  _Bool _Var3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  _Rb_tree_header *p_Var7;
  
  p_Var4 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (r->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(r->roarings)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var6 && (_Rb_tree_header *)p_Var4 != p_Var7) {
    do {
      _Var1 = p_Var4[1]._M_color;
      _Var2 = p_Var5[1]._M_color;
      _Var3 = roaring_bitmap_is_empty((roaring_bitmap_t *)&p_Var4[1]._M_parent);
      if (_Var3) {
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      }
      else {
        _Var3 = roaring_bitmap_is_empty((roaring_bitmap_t *)&p_Var5[1]._M_parent);
        if (!_Var3) {
          if (_Var1 != _Var2) {
            return false;
          }
          _Var3 = roaring_bitmap_equals
                            ((roaring_bitmap_t *)&p_Var4[1]._M_parent,
                             (roaring_bitmap_t *)&p_Var5[1]._M_parent);
          if (!_Var3) {
            return false;
          }
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      }
    } while (((_Rb_tree_header *)p_Var4 != p_Var7) && ((_Rb_tree_header *)p_Var5 != p_Var6));
  }
  while( true ) {
    if ((_Rb_tree_header *)p_Var4 == p_Var7) {
      if ((_Rb_tree_header *)p_Var5 == p_Var6) {
        _Var3 = true;
      }
      else {
        do {
          _Var3 = roaring_bitmap_is_empty((roaring_bitmap_t *)&p_Var5[1]._M_parent);
          if (!_Var3) {
            return _Var3;
          }
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
        } while ((_Rb_tree_header *)p_Var5 != p_Var6);
      }
      return _Var3;
    }
    _Var3 = roaring_bitmap_is_empty((roaring_bitmap_t *)&p_Var4[1]._M_parent);
    if (!_Var3) break;
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  }
  return false;
}

Assistant:

bool runOptimize() {
        return std::accumulate(
            roarings.begin(), roarings.end(), true,
            [](bool previous, std::pair<const uint32_t, Roaring> &map_entry) {
                return map_entry.second.runOptimize() && previous;
            });
    }